

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O3

void PHYSFS_utf8ToUcs4(char *src,PHYSFS_uint32 *dst,PHYSFS_uint64 len)

{
  PHYSFS_uint32 PVar1;
  ulong uVar2;
  char *local_28;
  
  uVar2 = len - 4;
  local_28 = src;
  while ((3 < uVar2 && (PVar1 = __PHYSFS_utf8codepoint(&local_28), PVar1 != 0))) {
    if (PVar1 == 0xffffffff) {
      PVar1 = 0x3f;
    }
    *dst = PVar1;
    dst = dst + 1;
    uVar2 = uVar2 - 4;
  }
  *dst = 0;
  return;
}

Assistant:

void PHYSFS_utf8ToUcs4(const char *src, PHYSFS_uint32 *dst, PHYSFS_uint64 len)
{
    len -= sizeof (PHYSFS_uint32);   /* save room for null char. */
    while (len >= sizeof (PHYSFS_uint32))
    {
        PHYSFS_uint32 cp = __PHYSFS_utf8codepoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        *(dst++) = cp;
        len -= sizeof (PHYSFS_uint32);
    } /* while */

    *dst = 0;
}